

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O3

void * sexp_try_alloc(sexp_conflict ctx,size_t size)

{
  sexp_heap_conflict psVar1;
  sexp_free_list __s;
  ulong uVar2;
  void *pvVar3;
  sexp_free_list psVar4;
  sexp_free_list_conflict psVar5;
  
  psVar1 = (ctx->value).context.heap;
  do {
    if (psVar1 == (sexp_heap_conflict)0x0) {
      return (void *)0x0;
    }
    __s = psVar1->free_list;
    while (psVar5 = __s, __s = psVar5->next, __s != (sexp_free_list)0x0) {
      uVar2 = __s->size;
      if (size <= uVar2) {
        if (uVar2 < size + 0x20) {
          psVar4 = __s->next;
        }
        else {
          psVar4 = (sexp_free_list)((long)&__s->size + size);
          *(ulong *)((long)&__s->size + size) = uVar2 - size;
          *(sexp_free_list *)((long)&__s->next + size) = __s->next;
        }
        psVar5->next = psVar4;
        pvVar3 = memset(__s,0,size);
        return pvVar3;
      }
    }
    psVar1 = psVar1->next;
  } while( true );
}

Assistant:

void* sexp_try_alloc (sexp ctx, size_t size) {
  sexp_free_list ls1, ls2, ls3;
  sexp_heap h;
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
  int found_fixed = 0;
#endif
  for (h=sexp_context_heap(ctx); h; h=h->next) {
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
    if (h->chunk_size) {
      if (h->chunk_size != size)
        continue;
      found_fixed = 1;
    } else if (found_fixed) {   /* don't use a non-fixed heap */
      return NULL;
    }
#endif
    for (ls1=h->free_list, ls2=ls1->next; ls2; ls1=ls2, ls2=ls2->next) {
      if (ls2->size >= size) {
#if SEXP_USE_DEBUG_GC > 1
        ls3 = (sexp_free_list) sexp_heap_end(h);
        if (ls2 >= ls3)
          fprintf(stderr, "alloced %lu bytes past end of heap: %p (%lu) >= %p"
                  " next: %p (%lu)\n", size, ls2, ls2->size, ls3, ls2->next,
                  (ls2->next ? ls2->next->size : 0));
#endif
        if (ls2->size >= (size + SEXP_MINIMUM_OBJECT_SIZE)) {
          ls3 = (sexp_free_list) (((char*)ls2)+size); /* the tail after ls2 */
          ls3->size = ls2->size - size;
          ls3->next = ls2->next;
          ls1->next = ls3;
        } else {                  /* take the whole chunk */
          ls1->next = ls2->next;
        }
        memset((void*)ls2, 0, size);
        return ls2;
      }
    }
  }
  return NULL;
}